

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh.h
# Opt level: O1

void * __thiscall embree::BVHN<4>::Allocator::operator()(Allocator *this,size_t bytes)

{
  size_t *psVar1;
  atomic<unsigned_long> *paVar2;
  FastAllocator *this_00;
  pointer *pppTVar3;
  BVHN<4> *pBVar4;
  ThreadLocal2 *this_01;
  iterator __position;
  void *pvVar5;
  long *plVar6;
  ThreadLocal2 *this_02;
  ulong uVar7;
  char *pcVar8;
  size_t sVar9;
  ulong uVar10;
  Lock<embree::MutexSys> lock;
  MutexSys local_50;
  char local_48;
  MutexSys local_40;
  _Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false> local_38;
  char local_30;
  _Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false> local_28;
  
  plVar6 = (long *)__tls_get_addr(&PTR_02224d38);
  this_02 = (ThreadLocal2 *)*plVar6;
  if (this_02 == (ThreadLocal2 *)0x0) {
    this_02 = (ThreadLocal2 *)alignedMalloc(0xc0,0x40);
    MutexSys::MutexSys((MutexSys *)this_02);
    (this_02->alloc)._M_b._M_p = (__pointer_type)0x0;
    (this_02->alloc0).parent = this_02;
    (this_02->alloc0).ptr = (char *)0x0;
    (this_02->alloc0).cur = 0;
    (this_02->alloc0).end = 0;
    (this_02->alloc0).allocBlockSize = 0;
    (this_02->alloc0).bytesUsed = 0;
    (this_02->alloc0).bytesWasted = 0;
    (this_02->alloc1).parent = this_02;
    (this_02->alloc1).ptr = (char *)0x0;
    (this_02->alloc1).cur = 0;
    (this_02->alloc1).end = 0;
    (this_02->alloc1).allocBlockSize = 0;
    (this_02->alloc1).bytesUsed = 0;
    (this_02->alloc1).bytesWasted = 0;
    *plVar6 = (long)this_02;
    local_50.mutex = &FastAllocator::s_thread_local_allocators_lock;
    local_48 = '\x01';
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    local_38._M_head_impl = this_02;
    std::
    vector<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>,std::allocator<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>>
    ::
    emplace_back<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>
              ((vector<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>,std::allocator<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>>
                *)FastAllocator::s_thread_local_allocators,
               (unique_ptr<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                *)&local_38);
    if (local_38._M_head_impl != (ThreadLocal2 *)0x0) {
      std::default_delete<embree::FastAllocator::ThreadLocal2>::operator()
                ((default_delete<embree::FastAllocator::ThreadLocal2> *)&local_38,
                 local_38._M_head_impl);
    }
    if (local_48 == '\x01') {
      MutexSys::unlock((MutexSys *)local_50.mutex);
    }
  }
  pBVar4 = this->bvh;
  this_00 = &pBVar4->alloc;
  this_01 = (this_02->alloc0).parent;
  local_40.mutex = (void *)bytes;
  if (this_00 != (this_01->alloc)._M_b._M_p) {
    local_30 = '\x01';
    local_38._M_head_impl = this_01;
    MutexSys::lock(&this_01->mutex);
    if ((this_01->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar2 = &((this_01->alloc)._M_b._M_p)->bytesUsed;
      (paVar2->super___atomic_base<unsigned_long>)._M_i =
           (paVar2->super___atomic_base<unsigned_long>)._M_i +
           (this_01->alloc1).bytesUsed + (this_01->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar2 = &((this_01->alloc)._M_b._M_p)->bytesFree;
      (paVar2->super___atomic_base<unsigned_long>)._M_i =
           (paVar2->super___atomic_base<unsigned_long>)._M_i +
           (((this_01->alloc0).end + (this_01->alloc1).end) -
           ((this_01->alloc0).cur + (this_01->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar2 = &((this_01->alloc)._M_b._M_p)->bytesWasted;
      (paVar2->super___atomic_base<unsigned_long>)._M_i =
           (paVar2->super___atomic_base<unsigned_long>)._M_i +
           (this_01->alloc1).bytesWasted + (this_01->alloc0).bytesWasted;
      UNLOCK();
    }
    (this_01->alloc0).bytesUsed = 0;
    (this_01->alloc0).bytesWasted = 0;
    (this_01->alloc0).end = 0;
    (this_01->alloc0).allocBlockSize = 0;
    (this_01->alloc0).ptr = (char *)0x0;
    (this_01->alloc0).cur = 0;
    (this_01->alloc0).allocBlockSize = (pBVar4->alloc).defaultBlockSize;
    (this_01->alloc1).ptr = (char *)0x0;
    (this_01->alloc1).cur = 0;
    (this_01->alloc1).end = 0;
    (this_01->alloc1).allocBlockSize = 0;
    (this_01->alloc1).bytesUsed = 0;
    (this_01->alloc1).bytesWasted = 0;
    (this_01->alloc1).allocBlockSize = (pBVar4->alloc).defaultBlockSize;
    LOCK();
    (this_01->alloc)._M_b._M_p = this_00;
    UNLOCK();
    local_50.mutex = &FastAllocator::s_thread_local_allocators_lock;
    local_48 = '\x01';
    local_28._M_head_impl = this_01;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    __position._M_current =
         (pBVar4->alloc).thread_local_allocators.
         super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (pBVar4->alloc).thread_local_allocators.
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
      ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                  *)&(pBVar4->alloc).thread_local_allocators,__position,&local_28._M_head_impl);
    }
    else {
      *__position._M_current = local_28._M_head_impl;
      pppTVar3 = &(pBVar4->alloc).thread_local_allocators.
                  super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppTVar3 = *pppTVar3 + 1;
    }
    if (local_48 == '\x01') {
      MutexSys::unlock((MutexSys *)local_50.mutex);
    }
    if (local_30 == '\x01') {
      MutexSys::unlock(&(local_38._M_head_impl)->mutex);
    }
  }
  psVar1 = &(this_02->alloc0).bytesUsed;
  *psVar1 = (long)local_40.mutex + *psVar1;
  sVar9 = (this_02->alloc0).cur;
  uVar10 = (ulong)(-(int)sVar9 & 0xf);
  uVar7 = (long)local_40.mutex + uVar10 + sVar9;
  (this_02->alloc0).cur = uVar7;
  if ((this_02->alloc0).end < uVar7) {
    (this_02->alloc0).cur = sVar9;
    pvVar5 = (void *)(this_02->alloc0).allocBlockSize;
    if (pvVar5 < local_40.mutex << 2) {
      pcVar8 = (char *)FastAllocator::malloc(this_00,(size_t)&local_40);
    }
    else {
      local_50.mutex = pvVar5;
      pcVar8 = (char *)FastAllocator::malloc(this_00,(size_t)&local_50);
      (this_02->alloc0).ptr = pcVar8;
      sVar9 = ((this_02->alloc0).end - (this_02->alloc0).cur) + (this_02->alloc0).bytesWasted;
      (this_02->alloc0).bytesWasted = sVar9;
      (this_02->alloc0).cur = 0;
      (this_02->alloc0).end = (size_t)local_50.mutex;
      (this_02->alloc0).cur = (size_t)local_40.mutex;
      if (local_50.mutex < local_40.mutex) {
        (this_02->alloc0).cur = 0;
        local_50.mutex = (void *)(this_02->alloc0).allocBlockSize;
        pcVar8 = (char *)FastAllocator::malloc(this_00,(size_t)&local_50);
        (this_02->alloc0).ptr = pcVar8;
        sVar9 = ((this_02->alloc0).end - (this_02->alloc0).cur) + (this_02->alloc0).bytesWasted;
        (this_02->alloc0).bytesWasted = sVar9;
        (this_02->alloc0).cur = 0;
        (this_02->alloc0).end = (size_t)local_50.mutex;
        (this_02->alloc0).cur = (size_t)local_40.mutex;
        if (local_50.mutex < local_40.mutex) {
          (this_02->alloc0).cur = 0;
          return (void *)0x0;
        }
      }
      (this_02->alloc0).bytesWasted = sVar9;
    }
  }
  else {
    psVar1 = &(this_02->alloc0).bytesWasted;
    *psVar1 = *psVar1 + uVar10;
    pcVar8 = (this_02->alloc0).ptr + (uVar7 - (long)local_40.mutex);
  }
  return pcVar8;
}

Assistant:

__forceinline void* operator() (size_t bytes) const { 
        return bvh->alloc._threadLocal()->malloc(&bvh->alloc,bytes); 
      }